

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O2

bool __thiscall CEditor::PopupSelectDoodadRuleSet(CEditor *this,void *pContext,CUIRect View)

{
  IAutoMapper *pIVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  CLayer *pCVar5;
  undefined4 extraout_var;
  ulong uVar6;
  int *pID;
  long in_FS_OFFSET;
  CUIRect Button;
  CUIRect local_58;
  CUIRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = View;
  pCVar5 = GetSelectedLayer(this,0);
  pIVar1 = (this->m_Map).m_lImages.list[*(int *)&pCVar5[1].m_pEditor]->m_pAutoMapper;
  pID = PopupSelectDoodadRuleSet::s_AutoMapperDoodadButtons;
  uVar2 = 0;
  do {
    uVar6 = uVar2;
    iVar3 = (*pIVar1->_vptr_IAutoMapper[5])(pIVar1);
    if ((long)iVar3 <= (long)uVar6) goto LAB_0019b462;
    CUIRect::HSplitTop(&local_48,2.0,(CUIRect *)0x0,&local_48);
    CUIRect::HSplitTop(&local_48,12.0,&local_58,&local_48);
    iVar4 = (*pIVar1->_vptr_IAutoMapper[6])(pIVar1,uVar6 & 0xffffffff);
    iVar4 = DoButton_Editor(this,pID,(char *)CONCAT44(extraout_var,iVar4),0,&local_58,0,(char *)0x0)
    ;
    pID = pID + 1;
    uVar2 = uVar6 + 1;
  } while (iVar4 == 0);
  pCVar5[2].m_Flags = (int)(uVar6 + 1) + -1;
LAB_0019b462:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (long)uVar6 < (long)iVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CEditor::PopupSelectDoodadRuleSet(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CLayerTiles *pLayer = static_cast<CLayerTiles*>(pEditor->GetSelectedLayer(0));
	CUIRect Button;
	static int s_AutoMapperDoodadButtons[IAutoMapper::MAX_RULES];
	IAutoMapper *pMapper = pEditor->m_Map.m_lImages[pLayer->m_Image]->m_pAutoMapper;

	for(int i = 0; i < pMapper->RuleSetNum(); ++i)
	{
		View.HSplitTop(2.0f, 0, &View);
		View.HSplitTop(12.0f, &Button, &View);
		if(pEditor->DoButton_Editor(&s_AutoMapperDoodadButtons[i], pMapper->GetRuleSetName(i), 0, &Button, 0, 0))
		{
			pLayer->m_SelectedRuleSet = i;
			return true; // close the popup
		}
	}

	return false;
}